

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapField
          (Reflection *this,Message *message1,Message *message2,FieldDescriptor *field)

{
  undefined8 uVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  long *plVar4;
  string *psVar5;
  Arena *arena;
  bool bVar6;
  CppType CVar7;
  uint32 uVar8;
  uint32 uVar9;
  int iVar10;
  ulong uVar11;
  LogMessage *pLVar12;
  undefined8 *puVar13;
  long *plVar14;
  ulong uVar15;
  Reflection *this_00;
  ArenaStringPtr *this_01;
  Arena *arena_00;
  RepeatedPtrFieldBase *other;
  RepeatedPtrFieldBase *this_02;
  ReflectionSchema *this_03;
  Message *__tmp;
  string *this_04;
  LogFinisher local_79;
  Arena *local_78;
  ulong local_70;
  string temp;
  
  iVar10 = *(int *)(field + 0x3c);
  CVar7 = FieldDescriptor::cpp_type(field);
  if (iVar10 != 3) {
    switch(CVar7 - CPPTYPE_INT32) {
    case 0:
    case CPPTYPE_INT64:
    case CPPTYPE_BOOL:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar3 = *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8)
      ;
      *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8) =
           *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
      *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar3
      ;
      break;
    case CPPTYPE_INT32:
    case CPPTYPE_UINT32:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar1 = *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8)
      ;
      *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8) =
           *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
      *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar1
      ;
      break;
    case CPPTYPE_UINT64:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar1 = *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8)
      ;
      *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8) =
           *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
      *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar1
      ;
      break;
    case CPPTYPE_DOUBLE:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar3 = *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8)
      ;
      *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8) =
           *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
      *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar3
      ;
      break;
    case CPPTYPE_FLOAT:
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar2 = *(undefined1 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8)
      ;
      *(undefined1 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8) =
           *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
      *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) = uVar2
      ;
      break;
    case CPPTYPE_ENUM:
      uVar11 = (ulong)(uint)(this->schema_).metadata_offset_;
      local_78 = *(Arena **)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11);
      if (((ulong)local_78 & 1) != 0) {
        local_78 = *(Arena **)(((ulong)local_78 & 0xfffffffffffffffe) + 0x18);
      }
      arena_00 = *(Arena **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar11);
      if (((ulong)arena_00 & 1) != 0) {
        arena_00 = *(Arena **)(((ulong)arena_00 & 0xfffffffffffffffe) + 0x18);
      }
      this_03 = &this->schema_;
      bVar6 = internal::ReflectionSchema::IsFieldInlined(this_03,field);
      uVar8 = internal::ReflectionSchema::GetFieldOffset(this_03,field);
      this_04 = (string *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
      uVar8 = internal::ReflectionSchema::GetFieldOffset(this_03,field);
      this_01 = (ArenaStringPtr *)
                ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
      if (bVar6) {
        std::__cxx11::string::swap(this_04);
        return;
      }
      puVar13 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(this_03,field);
      arena = local_78;
      if (local_78 == arena_00) {
        psVar5 = *(string **)this_04;
        *(string **)this_04 = this_01->ptr_;
        this_01->ptr_ = psVar5;
      }
      else {
        psVar5 = (string *)*puVar13;
        std::__cxx11::string::string((string *)&temp,*(string **)this_04);
        internal::ArenaStringPtr::Set((ArenaStringPtr *)this_04,psVar5,this_01->ptr_,arena);
        internal::ArenaStringPtr::Set(this_01,psVar5,&temp,arena_00);
        std::__cxx11::string::~string((string *)&temp);
      }
      break;
    case CPPTYPE_STRING:
      uVar11 = (ulong)(uint)(this->schema_).metadata_offset_;
      local_78 = *(Arena **)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11);
      if (((ulong)local_78 & 1) != 0) {
        local_78 = *(Arena **)(((ulong)local_78 & 0xfffffffffffffffe) + 0x18);
      }
      local_70 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar11);
      if ((local_70 & 1) != 0) {
        local_70 = *(ulong *)((local_70 & 0xfffffffffffffffe) + 0x18);
      }
      uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      uVar11 = (ulong)uVar8;
      uVar15 = (ulong)uVar9;
      plVar14 = *(long **)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11);
      if (local_78 != (Arena *)local_70) {
        plVar4 = *(long **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar15);
        local_78 = (Arena *)uVar15;
        if (plVar14 == (long *)0x0) {
          if (plVar4 == (long *)0x0) {
            return;
          }
          iVar10 = (*(message1->super_MessageLite)._vptr_MessageLite[5])(message1);
          plVar14 = (long *)(**(code **)(*plVar4 + 0x20))(plVar4,iVar10);
          *(long **)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11) = plVar14;
          (**(code **)(*plVar14 + 0x80))
                    (plVar14,*(undefined8 *)
                              ((long)&(message2->super_MessageLite)._vptr_MessageLite +
                              (long)local_78));
          message1 = message2;
        }
        else {
          local_70 = uVar11;
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar14 + 0xa8))(plVar14);
            Swap(this_00,*(Message **)
                          ((long)&(message1->super_MessageLite)._vptr_MessageLite + local_70),
                 *(Message **)
                  ((long)&(message2->super_MessageLite)._vptr_MessageLite + (long)local_78));
            return;
          }
          iVar10 = (*(message2->super_MessageLite)._vptr_MessageLite[5])(message2);
          plVar14 = (long *)(**(code **)(*plVar14 + 0x20))(plVar14,iVar10);
          *(long **)((long)&(message2->super_MessageLite)._vptr_MessageLite + (long)local_78) =
               plVar14;
          (**(code **)(*plVar14 + 0x80))
                    (plVar14,*(undefined8 *)
                              ((long)&(message1->super_MessageLite)._vptr_MessageLite + local_70));
        }
        ClearField(this,message1,field);
        return;
      }
      *(undefined8 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11) =
           *(undefined8 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar15);
      *(long **)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar15) = plVar14;
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)&temp,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1e0);
      pLVar12 = internal::LogMessage::operator<<((LogMessage *)&temp,"Unimplemented type: ");
      CVar7 = FieldDescriptor::cpp_type(field);
      pLVar12 = internal::LogMessage::operator<<(pLVar12,CVar7);
      internal::LogFinisher::operator=(&local_79,pLVar12);
LAB_002647e7:
      internal::LogMessage::~LogMessage((LogMessage *)&temp);
      return;
    }
    return;
  }
  switch(CVar7 - CPPTYPE_INT32) {
  case 0:
  case CPPTYPE_BOOL:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    RepeatedField<int>::Swap
              ((RepeatedField<int> *)
               ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
               (RepeatedField<int> *)
               ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
    return;
  case CPPTYPE_INT32:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    RepeatedField<long>::Swap
              ((RepeatedField<long> *)
               ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
               (RepeatedField<long> *)
               ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
    return;
  case CPPTYPE_INT64:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    RepeatedField<unsigned_int>::Swap
              ((RepeatedField<unsigned_int> *)
               ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
               (RepeatedField<unsigned_int> *)
               ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
    return;
  case CPPTYPE_UINT32:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    RepeatedField<unsigned_long>::Swap
              ((RepeatedField<unsigned_long> *)
               ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
               (RepeatedField<unsigned_long> *)
               ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
    return;
  case CPPTYPE_UINT64:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    RepeatedField<double>::Swap
              ((RepeatedField<double> *)
               ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
               (RepeatedField<double> *)
               ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
    return;
  case CPPTYPE_DOUBLE:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    RepeatedField<float>::Swap
              ((RepeatedField<float> *)
               ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
               (RepeatedField<float> *)
               ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
    return;
  case CPPTYPE_FLOAT:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    RepeatedField<bool>::Swap
              ((RepeatedField<bool> *)
               ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),
               (RepeatedField<bool> *)
               ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9));
    return;
  case CPPTYPE_ENUM:
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    this_02 = (RepeatedPtrFieldBase *)
              ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    uVar9 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    other = (RepeatedPtrFieldBase *)
            ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9);
    if (*(long *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar9) !=
        *(long *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8)) {
      internal::RepeatedPtrFieldBase::
      SwapFallback<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                (this_02,other);
      return;
    }
    break;
  case CPPTYPE_STRING:
    bVar6 = FieldDescriptor::is_map(field);
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    this_02 = (RepeatedPtrFieldBase *)
              ((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    uVar8 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    other = (RepeatedPtrFieldBase *)
            ((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar8);
    if (bVar6) {
      (*(this_02->arena_->impl_).options_.block_alloc)((size_t)this_02);
      return;
    }
    if (other->arena_ != this_02->arena_) {
      internal::RepeatedPtrFieldBase::
      SwapFallback<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                (this_02,other);
      return;
    }
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&temp,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x193);
    pLVar12 = internal::LogMessage::operator<<((LogMessage *)&temp,"Unimplemented type: ");
    CVar7 = FieldDescriptor::cpp_type(field);
    pLVar12 = internal::LogMessage::operator<<(pLVar12,CVar7);
    internal::LogFinisher::operator=(&local_79,pLVar12);
    goto LAB_002647e7;
  }
  internal::RepeatedPtrFieldBase::InternalSwap(this_02,other);
  return;
}

Assistant:

void Reflection::SwapField(Message* message1, Message* message2,
                           const FieldDescriptor* field) const {
  if (field->is_repeated()) {
    switch (field->cpp_type()) {
#define SWAP_ARRAYS(CPPTYPE, TYPE)                                 \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                         \
    MutableRaw<RepeatedField<TYPE> >(message1, field)              \
        ->Swap(MutableRaw<RepeatedField<TYPE> >(message2, field)); \
    break;

      SWAP_ARRAYS(INT32, int32);
      SWAP_ARRAYS(INT64, int64);
      SWAP_ARRAYS(UINT32, uint32);
      SWAP_ARRAYS(UINT64, uint64);
      SWAP_ARRAYS(FLOAT, float);
      SWAP_ARRAYS(DOUBLE, double);
      SWAP_ARRAYS(BOOL, bool);
      SWAP_ARRAYS(ENUM, int);
#undef SWAP_ARRAYS

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            MutableRaw<RepeatedPtrFieldBase>(message1, field)
                ->Swap<GenericTypeHandler<std::string> >(
                    MutableRaw<RepeatedPtrFieldBase>(message2, field));
            break;
        }
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message1, field)
              ->Swap(MutableRaw<MapFieldBase>(message2, field));
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message1, field)
              ->Swap<GenericTypeHandler<Message> >(
                  MutableRaw<RepeatedPtrFieldBase>(message2, field));
        }
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
    }
  } else {
    switch (field->cpp_type()) {
#define SWAP_VALUES(CPPTYPE, TYPE)                 \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:         \
    std::swap(*MutableRaw<TYPE>(message1, field),  \
              *MutableRaw<TYPE>(message2, field)); \
    break;

      SWAP_VALUES(INT32, int32);
      SWAP_VALUES(INT64, int64);
      SWAP_VALUES(UINT32, uint32);
      SWAP_VALUES(UINT64, uint64);
      SWAP_VALUES(FLOAT, float);
      SWAP_VALUES(DOUBLE, double);
      SWAP_VALUES(BOOL, bool);
      SWAP_VALUES(ENUM, int);
#undef SWAP_VALUES
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (GetArena(message1) == GetArena(message2)) {
          std::swap(*MutableRaw<Message*>(message1, field),
                    *MutableRaw<Message*>(message2, field));
        } else {
          Message** sub_msg1 = MutableRaw<Message*>(message1, field);
          Message** sub_msg2 = MutableRaw<Message*>(message2, field);
          if (*sub_msg1 == nullptr && *sub_msg2 == nullptr) break;
          if (*sub_msg1 && *sub_msg2) {
            (*sub_msg1)->GetReflection()->Swap(*sub_msg1, *sub_msg2);
            break;
          }
          if (*sub_msg1 == nullptr) {
            *sub_msg1 = (*sub_msg2)->New(message1->GetArena());
            (*sub_msg1)->CopyFrom(**sub_msg2);
            ClearField(message2, field);
          } else {
            *sub_msg2 = (*sub_msg1)->New(message2->GetArena());
            (*sub_msg2)->CopyFrom(**sub_msg1);
            ClearField(message1, field);
          }
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING: {
            Arena* arena1 = GetArena(message1);
            Arena* arena2 = GetArena(message2);

            if (IsInlined(field)) {
              InlinedStringField* string1 =
                  MutableRaw<InlinedStringField>(message1, field);
              InlinedStringField* string2 =
                  MutableRaw<InlinedStringField>(message2, field);
              string1->Swap(string2);
              break;
            }

            ArenaStringPtr* string1 =
                MutableRaw<ArenaStringPtr>(message1, field);
            ArenaStringPtr* string2 =
                MutableRaw<ArenaStringPtr>(message2, field);
            const std::string* default_ptr =
                &DefaultRaw<ArenaStringPtr>(field).Get();
            if (arena1 == arena2) {
              string1->Swap(string2, default_ptr, arena1);
            } else {
              const std::string temp = string1->Get();
              string1->Set(default_ptr, string2->Get(), arena1);
              string2->Set(default_ptr, temp, arena2);
            }
          } break;
        }
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
    }
  }
}